

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mySet.cpp
# Opt level: O3

mySet<float,_myComparator<float>_> * __thiscall
mySet<float,_myComparator<float>_>::operator=
          (mySet<float,_myComparator<float>_> *this,mySet<float,_myComparator<float>_> *ob)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  
  if (this != ob) {
    if (this->data != (float *)0x0) {
      operator_delete__(this->data);
    }
    uVar1 = ob->data_size;
    lVar5 = (long)(int)uVar1;
    this->data_size = uVar1;
    uVar4 = 0xffffffffffffffff;
    if (-3 < lVar5) {
      uVar4 = lVar5 * 4 + 8;
    }
    pfVar3 = (float *)operator_new__(uVar4);
    this->data = pfVar3;
    if (0 < lVar5) {
      pfVar2 = ob->data;
      lVar5 = 1;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while ((ulong)uVar1 + 1 != lVar5);
    }
  }
  return this;
}

Assistant:

mySet<T, C>& mySet<T, C>::operator=(mySet<T, C>const& ob)
{
    if(this != &ob)
    {
            delete[] data;
            data_size = ob.data_size;
            data = new T[ob.data_size+2];
            for(int i =1; i < data_size+1; i++)
            data[i] = ob.data[i];
    }
    return *this;
}